

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::TranslatePath(ClipperLib *this,Path *input,Path *output,IntPoint delta)

{
  long lVar1;
  pointer pIVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
            (input,*(long *)(this + 8) - *(long *)this >> 4);
  lVar1 = *(long *)this;
  if (*(long *)(this + 8) - lVar1 != 0) {
    lVar4 = *(long *)(this + 8) - lVar1 >> 4;
    pIVar2 = (input->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar5 = 8;
    do {
      lVar3 = *(long *)(lVar1 + lVar5);
      *(long *)((long)pIVar2 + lVar5 + -8) =
           (long)&(output->
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                  _M_impl.super__Vector_impl_data._M_start + *(long *)(lVar1 + -8 + lVar5);
      *(long *)((long)&pIVar2->X + lVar5) = lVar3 + delta.X;
      lVar5 = lVar5 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void TranslatePath(const Path& input, Path& output, const IntPoint delta)
{
  //precondition: input != output
  output.resize(input.size());
  for (size_t i = 0; i < input.size(); ++i)
    output[i] = IntPoint(input[i].X + delta.X, input[i].Y + delta.Y);
}